

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O0

void fs_prepare_cb(uv_prepare_t *handle)

{
  int iVar1;
  uv_loop_t *loop;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_metrics_t metrics;
  uv_prepare_t *handle_local;
  
  metrics.reserved[0xc] = (uint64_t *)handle;
  loop = uv_default_loop();
  iVar1 = uv_metrics_info(loop,(uv_metrics_t *)&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0xf8,"uv_metrics_info(uv_default_loop(), &metrics)","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((pool_events_counter == 1) && (metrics.loop_count != metrics.events)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-metrics.c"
            ,0xfb,"metrics.events","==","metrics.events_waiting",metrics.loop_count,"==",
            metrics.events);
    abort();
  }
  if (6 < pool_events_counter) {
    uv_prepare_stop((uv_prepare_t *)metrics.reserved[0xc]);
    pool_events_counter = -0x2a;
  }
  return;
}

Assistant:

static void fs_prepare_cb(uv_prepare_t* handle) {
  uv_metrics_t metrics;

  ASSERT_OK(uv_metrics_info(uv_default_loop(), &metrics));

  if (pool_events_counter == 1)
    ASSERT_EQ(metrics.events, metrics.events_waiting);

  if (pool_events_counter < 7)
    return;

  uv_prepare_stop(handle);
  pool_events_counter = -42;
}